

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etdc.c
# Opt level: O2

void etdc_new_symbol(etdc_table **table,uint s)

{
  UT_hash_handle *pUVar1;
  UT_hash_bucket *pUVar2;
  UT_hash_table *pUVar3;
  UT_hash_bucket *__ptr;
  UT_hash_handle *pUVar4;
  UT_hash_handle *pUVar5;
  etdc_table *peVar6;
  UT_hash_table *pUVar7;
  etdc_table *peVar8;
  UT_hash_bucket *pUVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  UT_hash_handle *pUVar17;
  char *_hj_key;
  
  peVar6 = (etdc_table *)malloc(0x50);
  peVar6->symbol = s;
  peVar6->freq = 1;
  pUVar1 = &peVar6->hh;
  (peVar6->hh).next = (void *)0x0;
  (peVar6->hh).key = peVar6;
  (peVar6->hh).keylen = 4;
  if (*table == (etdc_table *)0x0) {
    *table = peVar6;
    (peVar6->hh).prev = (void *)0x0;
    pUVar7 = (UT_hash_table *)calloc(1,0x40);
    (peVar6->hh).tbl = pUVar7;
    if (pUVar7 == (UT_hash_table *)0x0) goto LAB_00101a92;
    pUVar7->tail = pUVar1;
    pUVar7->num_buckets = 0x20;
    pUVar7->log2_num_buckets = 5;
    pUVar7->hho = 0x18;
    pUVar9 = (UT_hash_bucket *)calloc(1,0x200);
    pUVar7->buckets = pUVar9;
    if (pUVar9 == (UT_hash_bucket *)0x0) goto LAB_00101a92;
    pUVar7->signature = 0xa0111fe1;
    peVar8 = peVar6;
  }
  else {
    (((*table)->hh).tbl)->tail->next = peVar6;
    pUVar7 = ((*table)->hh).tbl;
    (peVar6->hh).prev = (void *)((long)pUVar7->tail - pUVar7->hho);
    pUVar7->tail = pUVar1;
    pUVar7 = ((*table)->hh).tbl;
    peVar8 = *table;
  }
  uVar13 = pUVar7->num_items + 1;
  pUVar7->num_items = uVar13;
  (peVar6->hh).tbl = pUVar7;
  uVar11 = (int)(char)peVar6->symbol +
           *(char *)((long)&peVar6->symbol + 1) * 0x100 +
           *(char *)((long)&peVar6->symbol + 2) * 0x10000 +
           (uint)*(byte *)((long)&peVar6->symbol + 3) * 0x1000000 + 0x112410d ^ 0x7f76d;
  uVar10 = uVar11 << 8 ^ 0x9f49bac6 - uVar11;
  uVar14 = uVar10 >> 0xd ^ (-0x112410d - uVar11) - uVar10;
  uVar16 = uVar14 >> 0xc ^ (uVar11 - uVar10) - uVar14;
  uVar11 = uVar16 << 0x10 ^ (uVar10 - uVar14) - uVar16;
  uVar10 = uVar11 >> 5 ^ (uVar14 - uVar16) - uVar11;
  uVar14 = uVar10 >> 3 ^ (uVar16 - uVar11) - uVar10;
  uVar11 = uVar14 << 10 ^ (uVar11 - uVar10) - uVar14;
  uVar10 = uVar11 >> 0xf ^ uVar10 - (uVar14 + uVar11);
  (peVar6->hh).hashv = uVar10;
  pUVar3 = (peVar8->hh).tbl;
  uVar10 = pUVar3->num_buckets - 1 & uVar10;
  pUVar9 = pUVar3->buckets;
  pUVar9[uVar10].count = pUVar9[uVar10].count + 1;
  pUVar17 = pUVar9[uVar10].hh_head;
  (peVar6->hh).hh_next = pUVar17;
  (peVar6->hh).hh_prev = (UT_hash_handle *)0x0;
  if (pUVar17 != (UT_hash_handle *)0x0) {
    pUVar17->hh_prev = pUVar1;
    pUVar9 = (((*table)->hh).tbl)->buckets;
  }
  pUVar9[uVar10].hh_head = pUVar1;
  pUVar9 = (((*table)->hh).tbl)->buckets;
  if ((pUVar9[uVar10].expand_mult * 10 + 10 <= pUVar9[uVar10].count) && (pUVar7->noexpand != 1)) {
    uVar10 = pUVar7->num_buckets;
    uVar11 = uVar10 * 2;
    pUVar9 = (UT_hash_bucket *)calloc(1,(ulong)uVar11 << 4);
    if (pUVar9 == (UT_hash_bucket *)0x0) {
LAB_00101a92:
      exit(-1);
    }
    uVar11 = uVar11 - 1;
    uVar14 = ((uVar13 >> ((char)pUVar7->log2_num_buckets + 1U & 0x1f)) + 1) -
             (uint)((uVar11 & uVar13) == 0);
    pUVar7->ideal_chain_maxlen = uVar14;
    pUVar7->nonideal_items = 0;
    __ptr = pUVar7->buckets;
    uVar13 = 0;
    for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
      pUVar17 = __ptr[uVar15].hh_head;
      while (pUVar17 != (UT_hash_handle *)0x0) {
        pUVar4 = pUVar17->hh_next;
        uVar12 = pUVar17->hashv & uVar11;
        pUVar2 = pUVar9 + uVar12;
        uVar16 = pUVar9[uVar12].count + 1;
        pUVar9[uVar12].count = uVar16;
        if (uVar14 < uVar16) {
          uVar13 = uVar13 + 1;
          pUVar7->nonideal_items = uVar13;
          pUVar2->expand_mult = uVar16 / uVar14;
        }
        pUVar17->hh_prev = (UT_hash_handle *)0x0;
        pUVar5 = pUVar2->hh_head;
        pUVar17->hh_next = pUVar5;
        if (pUVar5 != (UT_hash_handle *)0x0) {
          pUVar5->hh_prev = pUVar17;
        }
        pUVar2->hh_head = pUVar17;
        pUVar17 = pUVar4;
      }
    }
    free(__ptr);
    pUVar7 = pUVar1->tbl;
    pUVar7->num_buckets = pUVar7->num_buckets << 1;
    pUVar7->log2_num_buckets = pUVar7->log2_num_buckets + 1;
    pUVar7->buckets = pUVar9;
    if (pUVar7->num_items >> 1 < pUVar7->nonideal_items) {
      uVar10 = pUVar7->ineff_expands + 1;
      pUVar7->ineff_expands = uVar10;
      if (1 < uVar10) {
        pUVar7->noexpand = 1;
      }
    }
    else {
      pUVar7->ineff_expands = 0;
    }
  }
  return;
}

Assistant:

void etdc_new_symbol( struct etdc_table **table, unsigned int s) {
  struct etdc_table *e;
  
  e = (struct etdc_table *)malloc(sizeof(struct etdc_table));
  e->symbol = s;
  e->freq = 1;

  //fprintf(stderr, "Adding new symbol to etdc table");
  HASH_ADD_INT(*table, symbol, e);
}